

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O1

void __thiscall
jaegertracing::thrift::AggregationValidatorClient::send_validateTrace
          (AggregationValidatorClient *this,string *traceId)

{
  TProtocol *pTVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  AggregationValidator_validateTrace_pargs args;
  AggregationValidator_validateTrace_pargs local_40;
  _func_int *local_30 [2];
  
  pTVar1 = this->oprot_;
  local_40._vptr_AggregationValidator_validateTrace_pargs = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"validateTrace","");
  __n = 0;
  (*pTVar1->_vptr_TProtocol[2])(pTVar1,&local_40,1);
  __buf = extraout_RDX;
  if (local_40._vptr_AggregationValidator_validateTrace_pargs != local_30) {
    operator_delete(local_40._vptr_AggregationValidator_validateTrace_pargs);
    __buf = extraout_RDX_00;
  }
  local_40._vptr_AggregationValidator_validateTrace_pargs =
       (_func_int **)&PTR__AggregationValidator_validateTrace_pargs_00268ac0;
  local_40.traceId = traceId;
  AggregationValidator_validateTrace_pargs::write(&local_40,(int)this->oprot_,__buf,__n);
  (*this->oprot_->_vptr_TProtocol[3])();
  peVar2 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_TTransport[10])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar2 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_TTransport[0xb])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  AggregationValidator_validateTrace_pargs::~AggregationValidator_validateTrace_pargs(&local_40);
  return;
}

Assistant:

void AggregationValidatorClient::send_validateTrace(const std::string& traceId)
{
  int32_t cseqid = 0;
  oprot_->writeMessageBegin("validateTrace", ::apache::thrift::protocol::T_CALL, cseqid);

  AggregationValidator_validateTrace_pargs args;
  args.traceId = &traceId;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();
}